

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

void __thiscall
cmsys::anon_unknown_3::SymbolProperties::SetFunction(SymbolProperties *this,char *function)

{
  string local_38;
  char *local_18;
  char *function_local;
  SymbolProperties *this_local;
  
  local_18 = function;
  function_local = (char *)this;
  (anonymous_namespace)::SymbolProperties::Demangle_abi_cxx11_(&local_38,this,function);
  std::__cxx11::string::operator=((string *)&this->Function,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void SetFunction(const char* function)
  {
    this->Function = this->Demangle(function);
  }